

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_complib.c
# Opt level: O1

int parse(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  CompilerContext ccontext;
  C_MemoryAllocator allocator;
  Ravi_CompilerInterface ravicomp_interface;
  lua_State *local_d8;
  ravi_State *local_d0;
  mspace local_c8;
  code *local_c0;
  code *local_b8;
  code *local_b0;
  code *local_a8;
  code *local_a0;
  undefined1 *local_98;
  char *local_90;
  size_t local_88;
  char *local_80;
  char *local_78;
  char local_70 [32];
  mspace *local_50;
  char *local_48;
  code *local_40;
  code *local_38;
  
  pcVar3 = (char *)0x0;
  pcVar2 = luaL_checklstring(L,1,(size_t *)0x0);
  iVar1 = lua_isstring(L,2);
  if (iVar1 != 0) {
    pcVar3 = luaL_checklstring(L,2,(size_t *)0x0);
  }
  local_d0 = L->l_G->ravi_state;
  local_d8 = L;
  local_c8 = create_mspace(0,0);
  local_c0 = mspace_realloc;
  local_b8 = mspace_calloc;
  local_b0 = mspace_free;
  local_a8 = create_mspace;
  local_a0 = destroy_mspace;
  local_98 = (undefined1 *)&local_d8;
  local_90 = pcVar2;
  local_88 = strlen(pcVar2);
  local_80 = "input";
  local_78 = "--dump-ast";
  local_70[0] = '\0';
  local_70[1] = '\0';
  local_70[2] = '\0';
  local_70[3] = '\0';
  local_70[4] = '\0';
  local_70[5] = '\0';
  local_70[6] = '\0';
  local_70[7] = '\0';
  local_70[8] = '\0';
  local_70[9] = '\0';
  local_70[10] = '\0';
  local_70[0xb] = '\0';
  local_70[0xc] = '\0';
  local_70[0xd] = '\0';
  local_70[0xe] = '\0';
  local_70[0xf] = 0;
  local_70[0x10] = '\0';
  local_70[0x11] = '\0';
  local_70[0x12] = '\0';
  local_70[0x13] = '\0';
  local_70[0x14] = '\0';
  local_70[0x15] = '\0';
  local_70[0x16] = '\0';
  local_70[0x17] = '\0';
  local_70[0x18] = '\0';
  local_70[0x19] = '\0';
  local_70[0x1a] = '\0';
  local_70[0x1b] = '\0';
  local_70[0x1c] = '\0';
  local_70[0x1d] = '\0';
  local_70[0x1e] = '\0';
  local_48 = (char *)0x0;
  local_40 = debug_message;
  local_38 = error_message;
  if (pcVar3 == (char *)0x0) {
    pcVar3 = (char *)local_d0->id;
    local_d0->id = (unsigned_long_long)(pcVar3 + 1);
    pcVar2 = "__luachunk_%lld";
  }
  else {
    pcVar2 = "%s";
  }
  local_50 = &local_c8;
  snprintf(local_70,0x1f,pcVar2,pcVar3);
  iVar1 = raviX_compile(&local_98);
  if (iVar1 == 0) {
    lua_pushstring(L,local_48);
    raviX_release(&local_98);
    destroy_mspace(local_c8);
  }
  else {
    raviX_release(&local_98);
    destroy_mspace(local_c8);
    lua_error(L);
  }
  return (uint)(iVar1 == 0);
}

Assistant:

static int parse(lua_State* L) {
  const char* s = luaL_checkstring(L, 1);
  const char* mainfunc = NULL;
  if (lua_isstring(L, 2)) {
    mainfunc = luaL_checkstring(L, 2);
  }
  struct CompilerContext ccontext = {.L = L, .jit = G(L)->ravi_state};
  C_MemoryAllocator allocator = {.arena = create_mspace(0, 0),
                                 .create_arena = create_mspace,
                                 .destroy_arena = destroy_mspace,
                                 .calloc = mspace_calloc,
                                 .realloc = mspace_realloc,
                                 .free = mspace_free};
  struct Ravi_CompilerInterface ravicomp_interface = {.source = s,
                                                      .source_len = strlen(s),
                                                      .source_name = "input",
                                                      .generated_code = NULL,
                                                      .context = &ccontext,
                                                      .compiler_options = "--dump-ast",
                                                      .memory_allocator = &allocator,
                                                      .debug_message = debug_message,
                                                      .error_message = error_message};
  if (mainfunc) {
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "%s", mainfunc);
  }
  else {
#ifdef USE_MIRJIT
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "__luachunk_%lld",
             ccontext.jit->id++);
#else
    snprintf(ravicomp_interface.main_func_name, sizeof ravicomp_interface.main_func_name, "mymain");
#endif
  }
  int rc = raviX_compile(&ravicomp_interface);
  if (rc == 0) {
    lua_pushstring(L, ravicomp_interface.generated_code);
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    return 1;
  }
  else {
    raviX_release(&ravicomp_interface);
    destroy_mspace(allocator.arena);
    lua_error(L);
    return 0;
  }
}